

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

float collision_cleanup(features *fs)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  unsigned_long uVar6;
  float fVar7;
  iterator pos;
  features_value_iterator local_10;
  unsigned_long *local_8;
  
  pfVar3 = (fs->values)._begin;
  local_8 = (fs->indicies)._begin;
  pfVar1 = (fs->values)._end;
  fVar7 = 0.0;
  if (pfVar3 != pfVar1) {
    uVar6 = 0xffffffffffffffff;
    pfVar2 = pfVar3;
    puVar4 = local_8;
    pfVar5 = pfVar3;
    do {
      if (uVar6 == *puVar4) {
        *pfVar2 = *pfVar5 + *pfVar2;
        pfVar3 = pfVar2;
      }
      else {
        fVar7 = fVar7 + *pfVar2 * *pfVar2;
        pfVar3 = pfVar2 + 1;
        local_8 = local_8 + 1;
        pfVar2[1] = *pfVar5;
        uVar6 = *puVar4;
        *local_8 = uVar6;
      }
      pfVar5 = pfVar5 + 1;
      puVar4 = puVar4 + 1;
      pfVar2 = pfVar3;
    } while (pfVar5 != pfVar1);
  }
  fVar7 = *pfVar3 * *pfVar3 + fVar7;
  fs->sum_feat_sq = fVar7;
  local_10._begin = pfVar3 + 1;
  local_8 = local_8 + 1;
  features::truncate_to(fs,&local_10);
  return fVar7;
}

Assistant:

float collision_cleanup(features& fs)
{
  uint64_t last_index = (uint64_t)-1;
  float sum_sq = 0.f;
  features::iterator pos = fs.begin();
  for (features::iterator& f : fs)
  {
    if (last_index == f.index())
      pos.value() += f.value();
    else
    {
      sum_sq += pos.value() * pos.value();
      ++pos;
      pos.value() = f.value();
      pos.index() = f.index();
      last_index = f.index();
    }
  }

  sum_sq += pos.value() * pos.value();
  fs.sum_feat_sq = sum_sq;
  ++pos;
  fs.truncate_to(pos);

  return sum_sq;
}